

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertexClustering.cpp
# Opt level: O2

deque<int,_std::allocator<int>_> * __thiscall
VertexClustering::sortNeighbor
          (deque<int,_std::allocator<int>_> *__return_storage_ptr__,VertexClustering *this,
          set<int,_std::less<int>,_std::allocator<int>_> *ring)

{
  bool bVar1;
  _Elt_pointer piVar2;
  _Rb_tree_node_base *p_Var3;
  int n;
  int first;
  set<int,_std::less<int>,_std::allocator<int>_> unsorted;
  _Rb_tree_color local_68;
  _Rb_tree_color local_64;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_Rb_tree
            (&local_60,&ring->_M_t);
  local_64 = local_60._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_color;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::erase
            (&local_60,(key_type *)&local_64);
  std::_Deque_base<int,_std::allocator<int>_>::_Deque_base
            (&__return_storage_ptr__->super__Deque_base<int,_std::allocator<int>_>);
  std::deque<int,_std::allocator<int>_>::push_back
            (__return_storage_ptr__,(value_type_conflict1 *)&local_64);
  if (local_60._M_impl.super__Rb_tree_header._M_node_count != 0) {
    p_Var3 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
LAB_0014ab8e:
    do {
      if ((_Rb_tree_header *)p_Var3 == &local_60._M_impl.super__Rb_tree_header) break;
      local_68 = p_Var3[1]._M_color;
      bVar1 = Vertex::hasNeighborVertex
                        ((Vertex *)
                         (&this->vGroupNew->field_0x0 +
                         (long)*(__return_storage_ptr__->
                                super__Deque_base<int,_std::allocator<int>_>)._M_impl.
                                super__Deque_impl_data._M_start._M_cur * 0x50),local_68);
      if (bVar1) {
        std::deque<int,_std::allocator<int>_>::push_front
                  (__return_storage_ptr__,(value_type_conflict1 *)&local_68);
      }
      else {
        piVar2 = (__return_storage_ptr__->super__Deque_base<int,_std::allocator<int>_>)._M_impl.
                 super__Deque_impl_data._M_finish._M_cur;
        if (piVar2 == (__return_storage_ptr__->super__Deque_base<int,_std::allocator<int>_>)._M_impl
                      .super__Deque_impl_data._M_finish._M_first) {
          piVar2 = (__return_storage_ptr__->super__Deque_base<int,_std::allocator<int>_>)._M_impl.
                   super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
        }
        bVar1 = Vertex::hasNeighborVertex
                          ((Vertex *)(&this->vGroupNew->field_0x0 + (long)piVar2[-1] * 0x50),
                           local_68);
        if (!bVar1) {
          p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
          goto LAB_0014ab8e;
        }
        std::deque<int,_std::allocator<int>_>::push_back
                  (__return_storage_ptr__,(value_type_conflict1 *)&local_68);
      }
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::erase
                (&local_60,(key_type *)&local_68);
      p_Var3 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    } while (local_60._M_impl.super__Rb_tree_header._M_node_count != 0);
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_60);
  return __return_storage_ptr__;
}

Assistant:

deque<int> VertexClustering::sortNeighbor(const set<int>& ring) {
	set<int> unsorted(ring);
	int first = *(unsorted.begin());
	unsorted.erase(first);
	deque<int> q;
	q.push_back(first);
	while (!unsorted.empty()) {
		bool modified = false;
		for (int n : unsorted) {
			if (vGroupNew->group[q.front()].hasNeighborVertex(n)) {
				q.push_front(n);
				unsorted.erase(n);
				modified = true;
				break;
			}
			if (vGroupNew->group[q.back()].hasNeighborVertex(n)) {
				q.push_back(n);
				unsorted.erase(n);
				modified = true;
				break;
			}
		}
		if (!modified)
			break;
	}
	return q;
}